

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O1

char * toLocalFormat(char *name)

{
  char cVar1;
  ushort uVar2;
  undefined8 *puVar3;
  undefined8 *__ptr;
  void *pvVar4;
  ushort uVar5;
  ushort uVar6;
  in_addr_t iVar7;
  uint uVar8;
  char *pcVar9;
  DNSRr *pDVar10;
  DNSRr *pDVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  void *pvVar16;
  DNSQuery *__src;
  void *pvVar17;
  ushort uVar18;
  char *pcVar19;
  long lVar20;
  int iVar21;
  in_addr_t *__dest;
  DNSRr *in_RSI;
  DNSRr *pDVar22;
  DNSRr *pDVar23;
  long *plVar24;
  char *pcVar25;
  ushort *puVar26;
  DNSRr *unaff_R12;
  ulong uVar27;
  ushort *dnsQuery;
  ushort unaff_retaddr;
  undefined2 unaff_retaddr_00;
  ushort unaff_retaddr_01;
  ushort unaff_retaddr_02;
  undefined2 uStack0000000000000008;
  ushort uStack000000000000000a;
  DNSQuery *in_stack_00000010;
  DNSRr *in_stack_00000018;
  DNSRr *in_stack_00000028;
  int iStack_1b4;
  ushort uStack_1b0;
  ushort uStack_1ae;
  ushort uStack_1ac;
  ushort uStack_1aa;
  void *pvStack_1a8;
  void *pvStack_1a0;
  uint uStack_194;
  DNSRr *pDStack_190;
  char *pcStack_188;
  char *pcStack_180;
  char *pcStack_178;
  char *pcStack_170;
  code *pcStack_168;
  DNSRr *pDStack_158;
  char *pcStack_150;
  DNSRr *pDStack_148;
  char *pcStack_140;
  char *pcStack_138;
  code *pcStack_130;
  char *pcStack_120;
  char *pcStack_118;
  DNSRr *pDStack_110;
  size_t sStack_108;
  char *pcStack_100;
  code *pcStack_f8;
  char *pcStack_e8;
  DNSRr *pDStack_e0;
  DNSRr *pDStack_d8;
  char *pcStack_d0;
  DNSRr *pDStack_c8;
  char *pcStack_c0;
  DNSRr *pDStack_b8;
  code *pcStack_b0;
  long *plStack_a0;
  DNSRr *pDStack_98;
  DNSRr *pDStack_90;
  DNSRr *pDStack_88;
  DNSRr *pDStack_80;
  code *pcStack_78;
  undefined1 auStack_6c [44];
  undefined8 *puStack_40;
  char *pcStack_38;
  
  plVar24 = (long *)&DAT_00000100;
  pcVar9 = (char *)malloc(0x100);
  if (pcVar9 != (char *)0x0) {
    cVar1 = *name;
    pcVar19 = pcVar9;
    while (cVar1 != '\0') {
      name = name + 1;
      if ('\0' < cVar1) {
        iVar21 = (int)cVar1;
        do {
          *pcVar19 = *name;
          pcVar19 = pcVar19 + 1;
          name = name + 1;
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
      }
      *pcVar19 = '.';
      pcVar19 = pcVar19 + 1;
      cVar1 = *name;
    }
    pcVar19[-1] = '\0';
    return pcVar9;
  }
  toLocalFormat_cold_1();
  *plVar24 = 0xc;
  uVar27 = (ulong)unaff_retaddr_01;
  auStack_6c._12_8_ = ZEXT28(unaff_retaddr_02);
  auStack_6c._4_8_ = ZEXT28(uStack000000000000000a);
  puStack_40 = (undefined8 *)0x0;
  auStack_6c._20_8_ = uVar27;
  pcStack_38 = name;
  if (uVar27 == 0) {
    pDVar10 = (DNSRr *)(auStack_6c + 0x1c);
  }
  else {
    unaff_R12 = (DNSRr *)auStack_6c;
    pDVar11 = (DNSRr *)(auStack_6c + 0x1c);
    do {
      pcStack_78 = (code *)0x101d1f;
      pDVar10 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar11->name + 0x10) = pDVar10;
      pcStack_78 = (code *)0x101d31;
      in_RSI = unaff_R12;
      pcVar9 = serilizeQuery(in_stack_00000010,(int *)unaff_R12);
      *(char **)pDVar10->name = pcVar9;
      *(long *)(pDVar10->name + 8) = (long)(int)auStack_6c._0_4_;
      pDVar10->name[0x10] = '\0';
      pDVar10->name[0x11] = '\0';
      pDVar10->name[0x12] = '\0';
      pDVar10->name[0x13] = '\0';
      pDVar10->name[0x14] = '\0';
      pDVar10->name[0x15] = '\0';
      pDVar10->name[0x16] = '\0';
      pDVar10->name[0x17] = '\0';
      *plVar24 = *plVar24 + (long)(int)auStack_6c._0_4_;
      in_stack_00000010 = in_stack_00000010 + 1;
      uVar27 = uVar27 - 1;
      pDVar11 = pDVar10;
    } while (uVar27 != 0);
  }
  pDVar11 = (DNSRr *)0x0;
  if (auStack_6c._12_8_ != 0) {
    pDVar11 = (DNSRr *)auStack_6c;
    uVar27 = auStack_6c._12_8_;
    pDVar23 = pDVar10;
    do {
      pcStack_78 = (code *)0x101d80;
      pDVar10 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar23->name + 0x10) = pDVar10;
      pcStack_78 = (code *)0x101d92;
      in_RSI = pDVar11;
      pcVar9 = serilizeRr(in_stack_00000018,(int *)pDVar11);
      *(char **)pDVar10->name = pcVar9;
      *(long *)(pDVar10->name + 8) = (long)(int)auStack_6c._0_4_;
      pDVar10->name[0x10] = '\0';
      pDVar10->name[0x11] = '\0';
      pDVar10->name[0x12] = '\0';
      pDVar10->name[0x13] = '\0';
      pDVar10->name[0x14] = '\0';
      pDVar10->name[0x15] = '\0';
      pDVar10->name[0x16] = '\0';
      pDVar10->name[0x17] = '\0';
      *plVar24 = *plVar24 + (long)(int)auStack_6c._0_4_;
      in_stack_00000018 = in_stack_00000018 + 1;
      uVar27 = uVar27 - 1;
      unaff_R12 = in_stack_00000018;
      pDVar23 = pDVar10;
    } while (uVar27 != 0);
  }
  uVar27 = 0;
  pDVar23 = pDVar10;
  if (auStack_6c._4_8_ != 0) {
    unaff_R12 = (DNSRr *)auStack_6c;
    uVar27 = auStack_6c._4_8_;
    do {
      pcStack_78 = (code *)0x101de2;
      pDVar11 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar23->name + 0x10) = pDVar11;
      pcStack_78 = (code *)0x101df4;
      in_RSI = unaff_R12;
      pcVar9 = serilizeRr(in_stack_00000028,(int *)unaff_R12);
      *(char **)pDVar11->name = pcVar9;
      *(long *)(pDVar11->name + 8) = (long)(int)auStack_6c._0_4_;
      pDVar11->name[0x10] = '\0';
      pDVar11->name[0x11] = '\0';
      pDVar11->name[0x12] = '\0';
      pDVar11->name[0x13] = '\0';
      pDVar11->name[0x14] = '\0';
      pDVar11->name[0x15] = '\0';
      pDVar11->name[0x16] = '\0';
      pDVar11->name[0x17] = '\0';
      *plVar24 = *plVar24 + (long)(int)auStack_6c._0_4_;
      pDVar10 = in_stack_00000028 + 1;
      uVar27 = uVar27 - 1;
      in_stack_00000028 = pDVar10;
      pDVar23 = pDVar11;
    } while (uVar27 != 0);
  }
  pcVar19 = (char *)(*plVar24 + 10);
  pcStack_78 = (code *)0x101e27;
  pcVar9 = (char *)malloc((size_t)pcVar19);
  if (pcVar9 != (char *)0x0) {
    _uStack0000000000000008 =
         CONCAT22((ushort)auStack_6c._4_8_ << 8 | (ushort)auStack_6c._4_8_ >> 8,
                  uStack0000000000000008);
    *(undefined4 *)(pcVar9 + 8) = _uStack0000000000000008;
    *(ulong *)pcVar9 =
         CONCAT26((ushort)auStack_6c._12_8_ << 8 | (ushort)auStack_6c._12_8_ >> 8,
                  CONCAT24((ushort)auStack_6c._20_8_ << 8 | (ushort)auStack_6c._20_8_ >> 8,
                           CONCAT22(unaff_retaddr_00,unaff_retaddr << 8 | unaff_retaddr >> 8)));
    pcVar19 = pcVar9 + 0xc;
    __ptr = puStack_40;
    while (__ptr != (undefined8 *)0x0) {
      pcStack_78 = (code *)0x101e8f;
      memcpy(pcVar19,(void *)*__ptr,__ptr[1]);
      pcVar19 = pcVar19 + __ptr[1];
      pcStack_78 = (code *)0x101e9d;
      free((void *)*__ptr);
      puVar3 = (undefined8 *)__ptr[2];
      pcStack_78 = (code *)0x101eaa;
      free(__ptr);
      __ptr = puVar3;
    }
    *plVar24 = (long)pcVar19 - (long)pcVar9;
    return pcVar9;
  }
  pcStack_78 = serilizeQuery;
  serilizeDNS_cold_1();
  pcStack_b0 = (code *)0x101ee5;
  pDVar22 = in_RSI;
  plStack_a0 = plVar24;
  pDStack_98 = unaff_R12;
  pDStack_90 = pDVar11;
  pDStack_88 = pDVar10;
  pDStack_80 = pDVar23;
  pcStack_78 = (code *)uVar27;
  pcVar12 = toInternetFormat(pcVar19);
  pcStack_b0 = (code *)0x101ef0;
  sVar13 = strlen(pcVar12);
  pcVar9 = (char *)(sVar13 + 6);
  pcStack_b0 = (code *)0x101ef9;
  pcVar14 = (char *)malloc((size_t)pcVar9);
  if (pcVar14 != (char *)0x0) {
    pcStack_b0 = (code *)0x101f0c;
    strcpy(pcVar14,pcVar12);
    pcStack_b0 = (code *)0x101f14;
    sVar13 = strlen(pcVar12);
    pcStack_b0 = (code *)0x101f25;
    free(pcVar12);
    *(ushort *)(pcVar14 + sVar13 + 1) =
         *(ushort *)(pcVar19 + 0x100) << 8 | *(ushort *)(pcVar19 + 0x100) >> 8;
    *(ushort *)(pcVar14 + sVar13 + 3) =
         *(ushort *)(pcVar19 + 0x102) << 8 | *(ushort *)(pcVar19 + 0x102) >> 8;
    *(int *)in_RSI->name = (int)sVar13 + 5;
    return pcVar14;
  }
  pcStack_b0 = serilizeRr;
  serilizeQuery_cold_1();
  pcStack_f8 = (code *)0x101f83;
  pDStack_e0 = pDVar22;
  pDStack_d8 = in_RSI;
  pcStack_d0 = pcVar12;
  pDStack_c8 = pDVar11;
  pcStack_c0 = pcVar19;
  pDStack_b8 = pDVar23;
  pcStack_b0 = (code *)uVar27;
  pcVar19 = toInternetFormat(pcVar9);
  if (*(short *)(pcVar9 + 0x100) == 1) {
    sVar13 = 4;
  }
  else {
    pcStack_f8 = (code *)0x101fa5;
    pcStack_e8 = toInternetFormat(pcVar9 + 0x10a);
    pcStack_f8 = (code *)0x101fb2;
    sVar13 = strlen(pcStack_e8);
  }
  pcStack_f8 = (code *)0x101fbd;
  sVar15 = strlen(pcVar19);
  iVar21 = (int)sVar13;
  pcVar25 = (char *)((long)iVar21 + sVar15 + 0xe);
  pcStack_f8 = (code *)0x101fcd;
  pcVar14 = (char *)malloc((size_t)pcVar25);
  if (pcVar14 == (char *)0x0) {
    pcStack_f8 = deserilizeQuery;
    serilizeRr_cold_1();
    pcStack_130 = (code *)0x1020ea;
    pDVar10 = pDVar22;
    pcStack_120 = pcVar19;
    pcStack_118 = pcVar12;
    pDStack_110 = pDVar11;
    sStack_108 = sVar13;
    pcStack_100 = pcVar9;
    pcStack_f8 = (code *)uVar27;
    pcVar19 = toLocalFormat(pcVar25);
    pcVar14 = (char *)0x104;
    pcStack_130 = (code *)0x1020f7;
    pcVar12 = (char *)malloc(0x104);
    if (pcVar12 != (char *)0x0) {
      pcStack_130 = (code *)0x10210a;
      strcpy(pcVar12,pcVar19);
      pcStack_130 = (code *)0x102112;
      sVar13 = strlen(pcVar25);
      pcStack_130 = (code *)0x102121;
      free(pcVar19);
      *(ushort *)(pcVar12 + 0x100) =
           *(ushort *)(pcVar25 + sVar13 + 1) << 8 | *(ushort *)(pcVar25 + sVar13 + 1) >> 8;
      *(ushort *)(pcVar12 + 0x102) =
           *(ushort *)(pcVar25 + sVar13 + 3) << 8 | *(ushort *)(pcVar25 + sVar13 + 3) >> 8;
      *(int *)pDVar22->name = (int)sVar13 + 5;
      return pcVar12;
    }
    pcStack_130 = deserilizeRr;
    deserilizeQuery_cold_1();
    pcStack_168 = (code *)0x10217a;
    pDVar23 = pDVar10;
    pDStack_158 = pDVar22;
    pcStack_150 = pcVar19;
    pDStack_148 = pDVar11;
    pcStack_140 = pcVar25;
    pcStack_138 = pcVar9;
    pcStack_130 = (code *)uVar27;
    pcVar12 = toLocalFormat(pcVar14);
    puVar26 = (ushort *)&DAT_0000020e;
    pcStack_168 = (code *)0x102187;
    pcVar25 = (char *)malloc(0x20e);
    if (pcVar25 == (char *)0x0) {
      pcStack_168 = deserializeDNS;
      deserilizeRr_cold_1();
      if (((DNSRr *)0xb < pDVar23) && (uStack_194 = (uint)puVar26[1], (puVar26[1] & 0x7078) == 0)) {
        uStack_1aa = puVar26[4];
        dnsQuery = puVar26 + 6;
        pvStack_1a0 = (void *)CONCAT62(pvStack_1a0._2_6_,puVar26[5]);
        uVar5 = puVar26[3];
        uVar2 = *puVar26;
        uVar6 = puVar26[2];
        uVar18 = uVar6 << 8 | uVar6 >> 8;
        uStack_1ac = uVar18;
        pDStack_190 = pDVar10;
        pcStack_188 = pcVar19;
        pcStack_180 = pcVar12;
        pcStack_178 = pcVar14;
        pcStack_170 = pcVar9;
        pcStack_168 = (code *)uVar27;
        if (uVar6 == 0) {
          pvVar16 = (void *)0x0;
        }
        else {
          pvStack_1a8 = (void *)CONCAT62(pvStack_1a8._2_6_,uVar5);
          pvVar16 = malloc((ulong)uVar18 * 0x100 + (ulong)uVar18 * 4);
          uVar8 = 1;
          if (1 < uVar18) {
            uVar8 = (uint)uVar18;
          }
          lVar20 = 0;
          do {
            __src = deserilizeQuery((char *)dnsQuery,&iStack_1b4);
            memcpy((void *)((long)pvVar16 + lVar20),__src,0x104);
            dnsQuery = (ushort *)((long)iStack_1b4 + (long)dnsQuery);
            free(__src);
            lVar20 = lVar20 + 0x104;
          } while ((ulong)(uVar8 << 8) + (ulong)uVar8 * 4 != lVar20);
          uVar5 = (ushort)pvStack_1a8;
        }
        uVar6 = uVar5 << 8 | uVar5 >> 8;
        uStack_1ae = uVar6;
        pvStack_1a8 = pvVar16;
        if (uVar5 == 0) {
          pvVar16 = (void *)0x0;
        }
        else {
          pvVar16 = malloc((ulong)uVar6 * 0x20c);
          uVar5 = 1;
          if (1 < uVar6) {
            uVar5 = uVar6;
          }
          lVar20 = 0;
          do {
            pDVar10 = deserilizeRr((char *)dnsQuery,&iStack_1b4);
            memcpy((void *)((long)pvVar16 + lVar20),pDVar10,0x20c);
            dnsQuery = (ushort *)((long)iStack_1b4 + (long)dnsQuery);
            free(pDVar10);
            lVar20 = lVar20 + 0x20c;
          } while ((ulong)uVar5 * 0x20c - lVar20 != 0);
        }
        uVar5 = (ushort)pvStack_1a0 << 8 | (ushort)pvStack_1a0 >> 8;
        if ((ushort)pvStack_1a0 == 0) {
          pvVar17 = (void *)0x0;
        }
        else {
          uStack_1b0 = uVar5;
          pvStack_1a0 = pvVar16;
          pvVar17 = malloc((ulong)uVar5 * 0x20c);
          uVar6 = 1;
          if (1 < uVar5) {
            uVar6 = uVar5;
          }
          lVar20 = 0;
          do {
            pDVar10 = deserilizeRr((char *)dnsQuery,&iStack_1b4);
            memcpy((void *)((long)pvVar17 + lVar20),pDVar10,0x20c);
            dnsQuery = (ushort *)((long)dnsQuery + (long)iStack_1b4);
            free(pDVar10);
            lVar20 = lVar20 + 0x20c;
            pvVar16 = pvStack_1a0;
            uVar5 = uStack_1b0;
          } while ((ulong)uVar6 * 0x20c - lVar20 != 0);
        }
        pvVar4 = pvStack_1a8;
        puVar26 = (ushort *)malloc(0x30);
        *puVar26 = uVar2 << 8 | uVar2 >> 8;
        puVar26[1] = (ushort)uStack_194;
        puVar26[2] = uStack_1ac;
        puVar26[3] = uStack_1ae;
        puVar26[4] = uStack_1aa;
        puVar26[5] = uVar5;
        puVar26[6] = 0;
        puVar26[7] = 0;
        *(void **)(puVar26 + 8) = pvVar4;
        *(void **)(puVar26 + 0xc) = pvVar16;
        puVar26[0x10] = 0;
        puVar26[0x11] = 0;
        puVar26[0x12] = 0;
        puVar26[0x13] = 0;
        *(void **)(puVar26 + 0x14) = pvVar17;
        return (char *)puVar26;
      }
      return (char *)0x0;
    }
    pcStack_168 = (code *)0x10219e;
    strcpy(pcVar25,pcVar12);
    pcStack_168 = (code *)0x1021a6;
    sVar13 = strlen(pcVar14);
    pcVar9 = pcVar14 + sVar13;
    pcStack_168 = (code *)0x1021b5;
    free(pcVar12);
    uVar5 = *(ushort *)(pcVar14 + sVar13 + 1) << 8 | *(ushort *)(pcVar14 + sVar13 + 1) >> 8;
    *(ushort *)(pcVar25 + 0x100) = uVar5;
    *(ushort *)(pcVar25 + 0x102) =
         *(ushort *)(pcVar14 + sVar13 + 3) << 8 | *(ushort *)(pcVar14 + sVar13 + 3) >> 8;
    uVar8 = *(uint *)(pcVar14 + sVar13 + 5);
    *(uint *)(pcVar25 + 0x104) =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    *(ushort *)(pcVar25 + 0x108) =
         *(ushort *)(pcVar14 + sVar13 + 9) << 8 | *(ushort *)(pcVar14 + sVar13 + 9) >> 8;
    if (uVar5 == 0xf) {
      pcStack_168 = (code *)0x102240;
      pcVar19 = toLocalFormat(pcVar9 + 0xd);
      pcStack_168 = (code *)0x10224b;
      strcpy(pcVar25 + 0x10a,pcVar19);
      pcStack_168 = (code *)0x102253;
      sVar13 = strlen(pcVar9 + 0xd);
      iVar21 = (int)pcVar9 + (int)sVar13 + 0xe;
    }
    else if (uVar5 == 1) {
      pcStack_168 = (code *)0x102219;
      pcVar19 = inet_ntoa((in_addr)*(in_addr_t *)(pcVar9 + 0xb));
      pcStack_168 = (code *)0x102224;
      strcpy(pcVar25 + 0x10a,pcVar19);
      iVar21 = (int)pcVar9 + 0xf;
    }
    else {
      pcVar19 = pcVar14 + sVar13 + 0xb;
      pcStack_168 = (code *)0x102275;
      pcVar9 = toLocalFormat(pcVar19);
      pcStack_168 = (code *)0x102280;
      strcpy(pcVar25 + 0x10a,pcVar9);
      pcStack_168 = (code *)0x102288;
      sVar13 = strlen(pcVar19);
      iVar21 = (int)pcVar19 + (int)sVar13 + 1;
    }
    *(int *)pDVar10->name = iVar21 - (int)pcVar14;
    return pcVar25;
  }
  pcStack_f8 = (code *)0x101fe4;
  strcpy(pcVar14,pcVar19);
  pcStack_f8 = (code *)0x101fec;
  sVar15 = strlen(pcVar19);
  pcStack_f8 = (code *)0x101ffd;
  free(pcVar19);
  pcVar19 = pcStack_e8;
  uVar5 = *(ushort *)(pcVar9 + 0x100);
  *(ushort *)(pcVar14 + sVar15 + 1) = uVar5 << 8 | uVar5 >> 8;
  *(ushort *)(pcVar14 + sVar15 + 3) =
       *(ushort *)(pcVar9 + 0x102) << 8 | *(ushort *)(pcVar9 + 0x102) >> 8;
  uVar8 = *(uint *)(pcVar9 + 0x104);
  *(uint *)(pcVar14 + sVar15 + 5) =
       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  uVar2 = (ushort)sVar13;
  if (uVar5 == 1) {
    *(ushort *)(pcVar14 + sVar15 + 9) = uVar2 << 8 | uVar2 >> 8;
  }
  else {
    if (uVar5 == 0xf) {
      *(ushort *)(pcVar14 + sVar15 + 9) = (uVar2 + 3) * 0x100 | (ushort)(uVar2 + 3) >> 8;
      (pcVar14 + sVar15 + 0xb)[0] = '\0';
      (pcVar14 + sVar15 + 0xb)[1] = '\x05';
      lVar20 = 0xd;
      goto LAB_00102072;
    }
    *(ushort *)(pcVar14 + sVar15 + 9) = (uVar2 + 1) * 0x100 | (ushort)(uVar2 + 1) >> 8;
  }
  lVar20 = 0xb;
LAB_00102072:
  __dest = (in_addr_t *)(pcVar14 + lVar20 + sVar15);
  if (uVar5 == 1) {
    pcStack_f8 = (code *)0x10208a;
    iVar7 = inet_addr(pcVar9 + 0x10a);
    *__dest = iVar7;
  }
  else {
    pcStack_f8 = (code *)0x1020a6;
    memcpy(__dest,pcStack_e8,(long)(iVar21 + 1));
    pcStack_f8 = (code *)0x1020ae;
    free(pcVar19);
  }
  *(int *)pDStack_e0->name = (((int)__dest + iVar21) - (int)pcVar14) + 1;
  return pcVar14;
}

Assistant:

char *toLocalFormat(char *name)
{

    char *result = (char *) malloc(256);
    checkMalloc(result);
    char *ptr = result;
    while (*name)
    {
        int p = *name++;
        for (int j = 0; j < (int) p; ++j)
        {

            *ptr++ = *name++;
        }
        *ptr++ = '.';
    }
    *--ptr = '\0';
    return result;
}